

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int archeck(int p,double *ar)

{
  int iVar1;
  double *coeff_00;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  double dVar2;
  double dVar3;
  int local_5c;
  int wmax;
  int *which;
  double wmaxv;
  double mod;
  double *zeroi;
  double *zeror;
  double *coeff;
  int i;
  int N;
  int check;
  double *ar_local;
  int p_local;
  
  iVar1 = p + 1;
  coeff_00 = (double *)malloc((long)iVar1 << 3);
  ZEROR = (double *)malloc((long)p << 3);
  ZEROI = (double *)malloc((long)p << 3);
  __ptr = malloc((long)iVar1 << 2);
  *coeff_00 = 1.0;
  for (coeff._4_4_ = 0; coeff._4_4_ < p; coeff._4_4_ = coeff._4_4_ + 1) {
    coeff_00[coeff._4_4_ + 1] = -ar[coeff._4_4_];
  }
  for (coeff._4_4_ = 0; coeff._4_4_ < iVar1; coeff._4_4_ = coeff._4_4_ + 1) {
    if ((coeff_00[coeff._4_4_] != 0.0) || (NAN(coeff_00[coeff._4_4_]))) {
      *(int *)((long)__ptr + (long)coeff._4_4_ * 4) = coeff._4_4_;
    }
    else {
      *(undefined4 *)((long)__ptr + (long)coeff._4_4_ * 4) = 0xffffffff;
    }
  }
  local_5c = -1;
  for (coeff._4_4_ = 0; coeff._4_4_ < iVar1; coeff._4_4_ = coeff._4_4_ + 1) {
    if (local_5c < *(int *)((long)__ptr + (long)coeff._4_4_ * 4)) {
      local_5c = *(int *)((long)__ptr + (long)coeff._4_4_ * 4);
    }
  }
  if (local_5c == 0) {
    free(coeff_00);
    free(ZEROR);
    free(ZEROI);
    free(__ptr);
  }
  else {
    polyroot(coeff_00,p,ZEROR,ZEROI);
    for (coeff._4_4_ = 0; coeff._4_4_ < p; coeff._4_4_ = coeff._4_4_ + 1) {
      dVar2 = pow(ZEROR[coeff._4_4_],2.0);
      dVar3 = pow(ZEROI[coeff._4_4_],2.0);
      dVar2 = sqrt(dVar2 + dVar3);
      if (dVar2 < 1.0) {
        free(coeff_00);
        free(ZEROR);
        free(ZEROI);
        free(__ptr);
        return 0;
      }
    }
    free(coeff_00);
    free(ZEROR);
    free(ZEROI);
    free(__ptr);
  }
  return 1;
}

Assistant:

int archeck(int p, double *ar) {
	int check, N, i;
	double *coeff,*zeror,*zeroi,mod,wmaxv;
	int *which,wmax;

	N = p + 1;
	check = 1;

	coeff = (double*)malloc(sizeof(double)*N);
	zeror = (double*)malloc(sizeof(double)*p);
	zeroi = (double*)malloc(sizeof(double)*p);
	which = (int*)malloc(sizeof(int)*N);

	coeff[0] = 1.0;

	for(i = 0; i < p;++i) {
		coeff[i+1] = -ar[i];
	}

	for(i = 0; i < N;++i) {
		if (coeff[i] != 0) {
			which[i] = i;
		} else {
			which[i] = -1;
		}
	}

	wmax = -1;

	for(i = 0; i < N;++i) {
		if (wmax < which[i]) {
			wmax = which[i];
		}
	}

	if (!wmax){
		free(coeff);
		free(zeror);
		free(zeroi);
		free(which);
		return 1;
	}

	//polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI)

	polyroot(coeff,p,zeror,zeroi);

	for(i = 0; i < p;++i) {
		mod = sqrt(pow(zeror[i],2.0) + pow(zeroi[i],2));
		if (mod < 1.0) {
			free(coeff);
			free(zeror);
			free(zeroi);
			free(which);
			return 0;
		}
	}


	free(coeff);
	free(zeror);
	free(zeroi);
	free(which);
	return check;
}